

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tl.cpp
# Opt level: O3

bool __thiscall pg::TLSolver::extractTangles(TLSolver *this,int startvertex,bitset *R,int *str)

{
  pointer *pppiVar1;
  ulong *puVar2;
  vector<int,std::allocator<int>> *pvVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint *puVar7;
  uint64_t *puVar8;
  iterator iVar9;
  Game *pGVar10;
  uint64_t *puVar11;
  size_t sVar12;
  iterator iVar13;
  iterator __position;
  char cVar14;
  bool bVar15;
  ostream *poVar16;
  int *piVar17;
  byte bVar18;
  int iVar19;
  ulong uVar20;
  uint *puVar21;
  int *piVar22;
  uint64_t *puVar23;
  int *piVar24;
  long lVar25;
  ulong uVar26;
  int to;
  uint uVar27;
  iterator __end2;
  ulong uVar28;
  uint uVar29;
  uint *puVar30;
  int tidx;
  int pr;
  int *_tout;
  vector<int,_std::allocator<int>_> *__range5;
  int *_vv;
  int local_ac;
  int *local_a8;
  int local_9c;
  uint64_t *local_98;
  _label_vertex local_90;
  undefined8 local_80;
  int local_78;
  uint local_74;
  vector<int,std::allocator<int>> *local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_68;
  vector<int*,std::allocator<int*>> *local_60;
  vector<int*,std::allocator<int*>> *local_58;
  vector<int,std::allocator<int>> *local_50;
  bitset *local_48;
  Game *local_40;
  int *local_38;
  
  uVar20 = (ulong)startvertex;
  local_9c = ((this->super_Solver).game)->_priority[uVar20];
  iVar19 = (this->pea_state).pointer;
  puVar7 = (this->pea_state).queue;
  (this->pea_state).pointer = iVar19 + 1;
  puVar7[iVar19] = startvertex;
  iVar19 = (this->pea_state).pointer;
  (this->pea_state).pointer = iVar19 + 1;
  puVar7[iVar19] = 0;
  puVar2 = (this->pea_root)._bits + (uVar20 >> 6);
  *puVar2 = *puVar2 | 1L << (uVar20 & 0x3f);
  uVar4 = this->pea_curidx;
  this->pea_curidx = uVar4 + 1;
  this->pea_vidx[uVar20] = uVar4;
  if ((this->pea_state).pointer == 0) {
    local_80 = 0;
  }
  else {
    local_50 = (vector<int,std::allocator<int>> *)&this->tpr;
    local_58 = (vector<int*,std::allocator<int*>> *)&this->tout;
    local_70 = (vector<int,std::allocator<int>> *)&this->tangle;
    local_80 = 0;
    local_60 = (vector<int*,std::allocator<int*>> *)&this->tv;
    local_68 = &this->tescs;
    local_a8 = str;
    local_78 = local_9c;
    local_48 = R;
    do {
      pvVar3 = local_70;
      local_40 = (this->super_Solver).game;
      puVar7 = (this->pea_state).queue;
      puVar30 = this->pea_vidx;
      puVar23 = (this->pea_root)._bits;
      local_98 = (local_40->_owner)._bits;
      puVar8 = local_48->_bits;
LAB_00172322:
      lVar25 = (long)(this->pea_state).pointer;
      uVar4 = puVar7[lVar25 + -2];
      uVar20 = (ulong)uVar4;
      uVar27 = puVar7[lVar25 + -1];
      bVar18 = (byte)uVar4;
      if ((((local_98[(ulong)(long)(int)uVar4 >> 6] >> (uVar20 & 0x3f) & 1) == 0 ^ (byte)local_78) &
          1) == 0) {
        iVar19 = local_40->_firstouts[(int)uVar4];
        piVar24 = local_40->_outedges;
        if (((ulong)uVar27 != 0) &&
           (puVar30[piVar24[(long)iVar19 + (ulong)(uVar27 - 1)]] < puVar30[uVar20])) {
          puVar30[uVar20] = puVar30[piVar24[(long)iVar19 + (ulong)(uVar27 - 1)]];
          puVar2 = puVar23 + (uVar4 >> 6);
          *puVar2 = *puVar2 & (-2L << (bVar18 & 0x3f) |
                              0xfffffffffffffffeU >> 0x40 - (bVar18 & 0x3f));
        }
        uVar29 = piVar24[(long)iVar19 + (ulong)uVar27];
        if (uVar29 != 0xffffffff) {
          puVar21 = this->pea_vidx;
          puVar11 = (this->pea_root)._bits;
          do {
            uVar27 = uVar27 + 1;
            uVar26 = (ulong)(int)uVar29;
            uVar28 = uVar26 >> 6;
            if ((puVar8[uVar28] >> (uVar26 & 0x3f) & 1) != 0) {
              uVar5 = puVar21[uVar26];
              if (uVar5 == 0) goto LAB_00172465;
              if (uVar5 < puVar21[uVar20]) {
                puVar21[uVar20] = uVar5;
                puVar2 = puVar11 + (uVar4 >> 6);
                *puVar2 = *puVar2 & (-2L << (bVar18 & 0x3f) |
                                    0xfffffffffffffffeU >> 0x40 - (bVar18 & 0x3f));
              }
            }
            uVar29 = piVar24[(long)iVar19 + (ulong)uVar27];
            if (uVar29 == 0xffffffff) break;
          } while( true );
        }
      }
      else {
        uVar29 = str[uVar20];
        uVar26 = (ulong)(int)uVar29;
        uVar5 = puVar30[uVar26];
        if (uVar27 == 0 && uVar5 == 0) {
          puVar7[lVar25 + -1] = 1;
          puVar21 = puVar30 + uVar26;
          uVar28 = uVar26 >> 6;
          iVar19 = (this->pea_state).pointer;
          (this->pea_state).pointer = iVar19 + 1;
          puVar7[iVar19] = uVar29;
          iVar19 = (this->pea_state).pointer;
          (this->pea_state).pointer = iVar19 + 1;
          puVar7[iVar19] = 0;
          goto LAB_001724bd;
        }
        if (uVar5 < puVar30[uVar20]) {
          puVar30[uVar20] = uVar5;
          puVar2 = (this->pea_root)._bits + (uVar4 >> 6);
          *puVar2 = *puVar2 & (-2L << (bVar18 & 0x3f) |
                              0xfffffffffffffffeU >> 0x40 - (bVar18 & 0x3f));
        }
      }
      piVar24 = &(this->pea_state).pointer;
      *piVar24 = *piVar24 + -2;
      if (((this->pea_root)._bits[uVar4 >> 6] >> (uVar20 & 0x3f) & 1) == 0) {
        iVar19 = (this->pea_S).pointer;
        (this->pea_S).pointer = iVar19 + 1;
        (this->pea_S).queue[iVar19] = uVar4;
        str = local_a8;
      }
      else {
        this->pea_curidx = this->pea_curidx + -1;
        local_90.g = (Game *)CONCAT44(local_90.g._4_4_,uVar4);
        iVar9._M_current =
             (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar9._M_current ==
            (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)local_70,iVar9,(int *)&local_90);
          str = local_a8;
        }
        else {
          *iVar9._M_current = uVar4;
          (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar9._M_current + 1;
          str = local_a8;
        }
        while (iVar19 = (this->pea_S).pointer, iVar19 != 0) {
          uVar29 = (this->pea_S).queue[(long)iVar19 + -1];
          local_90.g = (Game *)CONCAT44(local_90.g._4_4_,uVar29);
          puVar30 = this->pea_vidx;
          if (puVar30[(int)uVar29] < puVar30[uVar20]) break;
          (this->pea_S).pointer = iVar19 + -1;
          this->pea_curidx = this->pea_curidx + -1;
          puVar30[(int)uVar29] = 0xffffffff;
          iVar9._M_current =
               (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar9._M_current ==
              (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (pvVar3,iVar9,(int *)&local_90);
          }
          else {
            *iVar9._M_current = uVar29;
            (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar9._M_current + 1;
          }
        }
        this->pea_vidx[uVar20] = 0xffffffff;
        piVar24 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        piVar17 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (((long)piVar24 - (long)piVar17 == 4) && (str[uVar20] != uVar4)) {
          if (str[uVar20] == 0xffffffff) {
            bVar15 = Game::has_edge((this->super_Solver).game,uVar4,uVar4);
            piVar17 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar24 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            if (bVar15) goto LAB_0017263c;
          }
          if (piVar24 != piVar17) {
            (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = piVar17;
          }
        }
        else {
LAB_0017263c:
          str = local_a8;
          if (piVar17 != piVar24) {
            puVar23 = (this->escapes)._bits;
            piVar22 = piVar17;
            do {
              iVar19 = *piVar22;
              piVar22 = piVar22 + 1;
              puVar2 = puVar23 + ((ulong)(long)iVar19 >> 6);
              *puVar2 = *puVar2 | 1L << ((long)iVar19 & 0x3fU);
            } while (piVar22 != piVar24);
            if (piVar17 != piVar24) {
              pGVar10 = (this->super_Solver).game;
              puVar23 = (this->G)._bits;
              local_98 = (pGVar10->_owner)._bits;
              piVar22 = piVar17;
              do {
                uVar20 = (ulong)*piVar22;
                if ((((local_98[uVar20 >> 6] >> (uVar20 & 0x3f) & 1) == 0 ^ (byte)local_78) & 1) ==
                    0) {
                  uVar4 = pGVar10->_outedges[pGVar10->_firstouts[uVar20]];
                  if (uVar4 != 0xffffffff) {
                    puVar8 = (this->S)._bits;
                    puVar7 = (this->tangleto).queue;
                    puVar11 = (this->escapes)._bits;
                    puVar30 = (uint *)(pGVar10->_outedges + (long)pGVar10->_firstouts[uVar20] + 1);
                    do {
                      uVar20 = (ulong)(long)(int)uVar4 >> 6;
                      if ((((puVar23[uVar20] >> ((ulong)uVar4 & 0x3f) & 1) != 0) &&
                          (uVar26 = 1L << ((ulong)uVar4 & 0x3f), (puVar8[uVar20] & uVar26) == 0)) &&
                         (uVar28 = puVar11[uVar20], (uVar28 & uVar26) == 0)) {
                        puVar11[uVar20] = uVar28 | uVar26;
                        iVar19 = (this->tangleto).pointer;
                        (this->tangleto).pointer = iVar19 + 1;
                        puVar7[iVar19] = uVar4;
                      }
                      uVar4 = *puVar30;
                      puVar30 = puVar30 + 1;
                    } while (uVar4 != 0xffffffff);
                  }
                }
                piVar22 = piVar22 + 1;
              } while (piVar22 != piVar24);
            }
          }
          uVar20 = (ulong)(uint)(this->tangleto).pointer;
          if (((long)piVar24 - (long)piVar17 >> 2) + uVar20 < (this->escapes)._size >> 6) {
            if (uVar20 != 0) {
              puVar7 = (this->tangleto).queue;
              puVar23 = (this->escapes)._bits;
              uVar26 = 0;
              do {
                uVar4 = puVar7[uVar26];
                uVar26 = uVar26 + 1;
                bVar18 = (byte)uVar4 & 0x3f;
                puVar2 = puVar23 + (uVar4 >> 6);
                *puVar2 = *puVar2 & (-2L << bVar18 | 0xfffffffffffffffeU >> 0x40 - bVar18);
              } while (uVar20 != uVar26);
            }
            if (piVar17 != piVar24) {
              puVar23 = (this->escapes)._bits;
              do {
                iVar19 = *piVar17;
                piVar17 = piVar17 + 1;
                bVar18 = (byte)iVar19 & 0x3f;
                puVar2 = puVar23 + ((ulong)(long)iVar19 >> 6);
                *puVar2 = *puVar2 & (-2L << bVar18 | 0xfffffffffffffffeU >> 0x40 - bVar18);
              } while (piVar17 != piVar24);
            }
          }
          else {
            sVar12 = (this->escapes)._bitssize;
            if (sVar12 != 0) {
              memset((this->escapes)._bits,0,sVar12 << 3);
            }
          }
          iVar19 = (this->super_Solver).trace;
          if (uVar20 == 0) {
            if (iVar19 != 0) {
              poVar16 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar16,"\x1b[1;38;5;201mdominion \x1b[36m",0x1b);
              poVar16 = (ostream *)std::ostream::operator<<(poVar16,local_9c);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\x1b[m",3);
              if (1 < (this->super_Solver).trace) {
                local_98 = (uint64_t *)
                           (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                puVar23 = (uint64_t *)
                          (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if (puVar23 != local_98) {
                  do {
                    poVar16 = (this->super_Solver).logger;
                    iVar19 = (int)*puVar23;
                    std::__ostream_insert<char,std::char_traits<char>>(poVar16," \x1b[1;36m",8);
                    local_90.g = (this->super_Solver).game;
                    local_90.v = iVar19;
                    poVar16 = operator<<(poVar16,&local_90);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\x1b[m",3);
                    piVar24 = local_a8;
                    if (local_a8[iVar19] != -1) {
                      poVar16 = (this->super_Solver).logger;
                      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"->",2);
                      local_90.v = piVar24[iVar19];
                      local_90.g = (this->super_Solver).game;
                      operator<<(poVar16,&local_90);
                    }
                    puVar23 = (uint64_t *)((long)puVar23 + 4);
                  } while (puVar23 != local_98);
                }
              }
              poVar16 = (this->super_Solver).logger;
              cVar14 = (char)poVar16;
              std::ios::widen((char)poVar16->_vptr_basic_ostream[-3] + cVar14);
              std::ostream::put(cVar14);
              std::ostream::flush();
              str = local_a8;
            }
            piVar17 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar24 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            if (piVar17 != piVar24) {
              puVar23 = (this->S)._bits;
              piVar22 = piVar17;
              do {
                iVar19 = *piVar22;
                piVar22 = piVar22 + 1;
                puVar2 = puVar23 + ((ulong)(long)iVar19 >> 6);
                *puVar2 = *puVar2 | 1L << ((long)iVar19 & 0x3fU);
              } while (piVar22 != piVar24);
              this->dominions = this->dominions + 1;
              local_80 = CONCAT71((int7)((ulong)puVar23 >> 8),1);
              if (piVar17 != piVar24) {
                (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = piVar17;
              }
              goto LAB_00172db2;
            }
            this->dominions = this->dominions + 1;
          }
          else {
            if (iVar19 < 1) {
              local_ac = (int)((ulong)((long)(this->tpr).
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_finish -
                                      (long)(this->tpr).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start) >> 2);
LAB_00172bc5:
              uVar20 = 0;
              do {
                pvVar3 = (vector<int,std::allocator<int>> *)
                         (this->tin + (this->tangleto).queue[uVar20]);
                iVar9._M_current = *(int **)(pvVar3 + 8);
                if (iVar9._M_current == *(int **)(pvVar3 + 0x10)) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (pvVar3,iVar9,&local_ac);
                }
                else {
                  *iVar9._M_current = local_ac;
                  *(int **)(pvVar3 + 8) = iVar9._M_current + 1;
                }
                uVar26 = (ulong)(uint)(this->tangleto).pointer;
                uVar20 = uVar20 + 1;
              } while (uVar20 < uVar26);
            }
            else {
              poVar16 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar16,"\x1b[1;38;5;198mnew tangle ",0x18);
              poVar16 = (ostream *)std::ostream::operator<<(poVar16,local_9c);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\x1b[m (",5);
              poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,")",1);
              if (1 < (this->super_Solver).trace) {
                local_98 = (uint64_t *)
                           (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                puVar23 = (uint64_t *)
                          (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if (puVar23 != local_98) {
                  do {
                    poVar16 = (this->super_Solver).logger;
                    iVar19 = (int)*puVar23;
                    std::__ostream_insert<char,std::char_traits<char>>(poVar16," \x1b[1;36m",8);
                    local_90.g = (this->super_Solver).game;
                    local_90.v = iVar19;
                    poVar16 = operator<<(poVar16,&local_90);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\x1b[m",3);
                    piVar24 = local_a8;
                    if (local_a8[iVar19] != -1) {
                      poVar16 = (this->super_Solver).logger;
                      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"->",2);
                      local_90.v = piVar24[iVar19];
                      local_90.g = (this->super_Solver).game;
                      operator<<(poVar16,&local_90);
                    }
                    puVar23 = (uint64_t *)((long)puVar23 + 4);
                  } while (puVar23 != local_98);
                }
              }
              poVar16 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>(poVar16," with ",6);
              poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16," escape vertices.",0x11);
              poVar16 = (this->super_Solver).logger;
              cVar14 = (char)poVar16;
              std::ios::widen((char)poVar16->_vptr_basic_ostream[-3] + cVar14);
              std::ostream::put(cVar14);
              std::ostream::flush();
              local_ac = (int)((ulong)((long)(this->tpr).
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_finish -
                                      (long)(this->tpr).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start) >> 2);
              str = local_a8;
              if ((this->tangleto).pointer != 0) goto LAB_00172bc5;
              uVar26 = 0;
            }
            local_90.g = (Game *)operator_new__((ulong)((int)uVar26 + 1) << 2);
            if ((int)uVar26 != 0) {
              puVar7 = (this->tangleto).queue;
              uVar20 = uVar26 + 1;
              lVar25 = 0;
              do {
                uVar20 = uVar20 - 1;
                *(undefined4 *)((long)&(local_90.g)->n_vertices + lVar25) =
                     *(undefined4 *)((long)puVar7 + lVar25);
                lVar25 = lVar25 + 4;
              } while (1 < uVar20);
            }
            *(int *)((long)&(local_90.g)->n_vertices + uVar26 * 4) = -1;
            iVar13._M_current =
                 (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar13._M_current ==
                (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int*,std::allocator<int*>>::_M_realloc_insert<int*const&>
                        (local_58,iVar13,(int **)&local_90);
            }
            else {
              *iVar13._M_current = (int *)local_90.g;
              pppiVar1 = &(this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              *pppiVar1 = *pppiVar1 + 1;
            }
            piVar24 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            piVar17 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            local_38 = (int *)operator_new__(-(ulong)(((long)piVar24 - (long)piVar17 >> 2 &
                                                      0x6000000000000000U) != 0) |
                                             ((long)piVar24 - (long)piVar17) * 2 + 4U);
            if (piVar24 == piVar17) {
              uVar20 = 0;
            }
            else {
              piVar22 = local_38 + 1;
              iVar19 = 0;
              do {
                iVar6 = *piVar17;
                piVar17 = piVar17 + 1;
                iVar19 = iVar19 + -2;
                piVar22[-1] = iVar6;
                *piVar22 = str[iVar6];
                piVar22 = piVar22 + 2;
              } while (piVar17 != piVar24);
              uVar20 = (ulong)(uint)-iVar19;
            }
            local_38[uVar20] = -1;
            iVar13._M_current =
                 (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar13._M_current ==
                (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int*,std::allocator<int*>>::_M_realloc_insert<int*const&>
                        (local_60,iVar13,&local_38);
            }
            else {
              *iVar13._M_current = local_38;
              pppiVar1 = &(this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              *pppiVar1 = *pppiVar1 + 1;
            }
            iVar9._M_current =
                 (this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar9._M_current ==
                (this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_50,iVar9,&local_9c);
            }
            else {
              *iVar9._M_current = local_9c;
              (this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar9._M_current + 1;
            }
            local_74 = 0;
            __position._M_current =
                 (this->tescs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->tescs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(local_68,__position,&local_74);
            }
            else {
              *__position._M_current = 0;
              (this->tescs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            this->tangles = this->tangles + 1;
            piVar17 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if ((this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish != piVar17) {
              (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = piVar17;
            }
            (this->tangleto).pointer = 0;
          }
          local_80 = CONCAT71((int7)((ulong)piVar17 >> 8),1);
        }
      }
LAB_00172db2:
    } while ((this->pea_state).pointer != 0);
  }
  (this->pea_S).pointer = 0;
  return (bool)((byte)local_80 & 1);
LAB_00172465:
  puVar21 = puVar21 + uVar26;
  puVar7[(long)(this->pea_state).pointer + -1] = uVar27;
  iVar19 = (this->pea_state).pointer;
  (this->pea_state).pointer = iVar19 + 1;
  puVar7[iVar19] = uVar29;
  iVar19 = (this->pea_state).pointer;
  (this->pea_state).pointer = iVar19 + 1;
  puVar7[iVar19] = 0;
LAB_001724bd:
  puVar2 = puVar23 + uVar28;
  *puVar2 = *puVar2 | 1L << (uVar26 & 0x3f);
  uVar4 = this->pea_curidx;
  this->pea_curidx = uVar4 + 1;
  *puVar21 = uVar4;
  str = local_a8;
  goto LAB_00172322;
}

Assistant:

bool
TLSolver::extractTangles(int startvertex, bitset &R, int *str)
{
    bool new_tangles = false;
    const int pr = priority(startvertex);
    const int pl = pr&1;

    /**
     * The following is the nonrecursive implementation of David Pearce,
     * "A space-efficient algorithm for finding strongly connected components" (IPL, 2016),
     * modified to on-the-fly restrict the graph by <R> and <str>.
     */

    // beginVisiting
    pea_state.push(startvertex);
    pea_state.push(0);
    pea_root[startvertex] = true;
    pea_vidx[startvertex] = pea_curidx++;
    while (pea_state.nonempty()) {
pearce_again:
        // visitLoop
        const unsigned int n = pea_state.back2();
        unsigned int i = pea_state.back();

        if (owner(n) != pl) {
            auto edges = outs(n);
            if (i>0) {
                // finishEdge
                const int w = edges[i-1];
                if (pea_vidx[w] < pea_vidx[n]) {
                    pea_vidx[n] = pea_vidx[w];
                    pea_root[n] = false;
                }
            }
            for (;;) {
                const int to = edges[i];
                if (to == -1) break; // done
                // beginEdge
                if (R[to]) {
                    if (pea_vidx[to] == 0) {
                        pea_state.back() = i+1;
                        // beginVisiting
                        pea_state.push(to);
                        pea_state.push(0);
                        pea_root[to] = true;
                        pea_vidx[to] = pea_curidx++;
                        goto pearce_again; // break; continue;
                    } else {
                        // finishEdge
                        if (pea_vidx[to] < pea_vidx[n]) {
                            pea_vidx[n] = pea_vidx[to];
                            pea_root[n] = false;
                        }
                    }
                }
                i++;
            }
        } else {
            const int s = str[n];
            if (i == 0) {
                // beginEdge
                if (pea_vidx[s] == 0) {
                    pea_state.back() = 1;
                    // beginVisiting
                    pea_state.push(s);
                    pea_state.push(0);
                    pea_root[s] = true;
                    pea_vidx[s] = pea_curidx++;
                    goto pearce_again; // break; continue;
                }
            }
            // finishEdge
            if (pea_vidx[s] < pea_vidx[n]) {
                pea_vidx[n] = pea_vidx[s];
                pea_root[n] = false;
            }
        }
        // finishVisiting
        pea_state.pop2();
        if (pea_root[n]) {
            pea_curidx -= 1;
            tangle.push_back(n);
            while (pea_S.nonempty()) {
                const int t = pea_S.back();
                if (pea_vidx[n]>pea_vidx[t]) break;
                pea_S.pop();
                pea_curidx -= 1;
                pea_vidx[t] = (unsigned int)-1;
                tangle.push_back(t);
            }
            pea_vidx[n] = (unsigned int)-1;
        } else {
            pea_S.push(n);
            continue;
        }

        /**
         * End of Pearce's algorithm.
         * At this point, we have an SCC in <tangle>.
         *
         * Now check if the SCC is nontrivial, i.e., contains a cycle, i.e., either 2+ vertices
         * or a self-loop.
         */

        const bool is_not_tangle = (tangle.size() == 1) and
            ((unsigned int)str[n] != n) and (str[n] != -1 or !game.has_edge(n, n));
        if (is_not_tangle) {
            // std::cout << "not a tangle: " << pea_vidx[n] << std::endl;
            tangle.clear();
            continue;
        }

        /**
         * We have a tangle. Compute the outgoing edges (into <tangleto>) and the next highest region.
         */

        for (const int v : tangle) escapes[v] = true;

        for (const int v : tangle) {
            if (owner(v) != pl) {
                for (auto curedge = outs(v); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (G[to] and !S[to] && !escapes[to]) {
                        escapes[to] = true;
                        tangleto.push(to);
                    }
                }
            }
        }

        if ((tangle.size()+tangleto.size()) < (escapes.size()/64)) {
            for (unsigned int x = 0; x < tangleto.size(); x++) escapes[tangleto[x]] = false;
            for (const int v : tangle) escapes[v] = false;
        } else {
            escapes.reset(); // this is very expensive on large practical games with many small tangles
        }

        /**
         * If there are no outgoing edges, then we have found a dominion.
         */

        if (tangleto.empty()) {
            // dominion
#ifndef NDEBUG
            if (trace) {
                logger << "\033[1;38;5;201mdominion \033[36m" << pr << "\033[m";
                if (trace >= 2) {
                    for (const int v : tangle) {
                        logger << " \033[1;36m" << label_vertex(v) << "\033[m";
                        if (str[v] != -1) logger << "->" << label_vertex(str[v]);
                    }
                }
                logger << std::endl;
            }
#endif
            for (const int v : tangle) S[v] = true;
            dominions++;
            tangle.clear();
            new_tangles = true;
            continue;
        }

        /**
         * We're not a dominion, we're a tangle.
         */

#ifndef NDEBUG
        if (trace >= 1) {
            logger << "\033[1;38;5;198mnew tangle " << pr << "\033[m (" << tpr.size() << ")";
            if (trace >= 2) {
                for (const int v : tangle) {
                    logger << " \033[1;36m" << label_vertex(v) << "\033[m";
                    if (str[v] != -1) logger << "->" << label_vertex(str[v]);
                }
            }
            logger << " with " << tangleto.size() << " escape vertices.";
            logger << std::endl;
        }
#endif

        // new tangle idx
        const int tidx = tpr.size();

        // add back links to all normal vertices in our [out]
        for (unsigned int x = 0; x < tangleto.size(); x++) tin[tangleto[x]].push_back(tidx);

        // move tangleto into vout
        int* _tout = new int[tangleto.size()+1];
        std::copy(&tangleto[0], &tangleto[tangleto.size()], _tout);
        _tout[tangleto.size()] = -1;
        tout.push_back(_tout);

        // move tangle into vv
        int* _vv = new int[tangle.size()*2+1], c=0;
        for (const int v : tangle) {
            _vv[c++] = v;
            _vv[c++] = str[v];
        }
        _vv[c] = -1;
        tv.push_back(_vv);

        // and set p to pr
        tpr.push_back(pr);
        tescs.push_back(0);

        tangles++;
        tangle.clear();
        tangleto.clear();
        new_tangles = true;
    }

    pea_S.clear();
    return new_tangles;
}